

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_brep_tools.cpp
# Opt level: O1

bool __thiscall ON_Brep::HasSlits(ON_Brep *this,ON_BrepFace *F)

{
  int iVar1;
  bool bVar2;
  ON_BrepLoop *L;
  int iVar3;
  int t1;
  int t0;
  int iStack_28;
  int local_24;
  
  if (F->m_face_index < 0) {
    return false;
  }
  iVar3 = (F->m_li).m_count;
  bVar2 = 0 < iVar3;
  if (0 < iVar3) {
    iVar3 = 0;
    do {
      L = ON_BrepFace::Loop(F,iVar3);
      if (L == (ON_BrepLoop *)0x0) {
        bVar2 = false;
      }
      else if (L->m_loop_index < 0) {
        bVar2 = false;
      }
      else {
        bVar2 = true;
        if (L->m_type != slit) {
          bVar2 = FoundSlitPair(L,&local_24,&iStack_28);
        }
      }
      if (bVar2 != false) {
        return true;
      }
      iVar3 = iVar3 + 1;
      iVar1 = (F->m_li).m_count;
      bVar2 = iVar3 < iVar1;
    } while (iVar3 < iVar1);
  }
  return bVar2;
}

Assistant:

bool ON_Brep::HasSlits(const ON_BrepFace& F) const

{
  if (F.m_face_index < 0)
    return false;
  int i;
  for (i=0; i<F.m_li.Count(); i++){
    const ON_BrepLoop* pL = F.Loop(i);
    if (!pL)
      continue;
    if (HasSlits(*pL))
      return true;
  }
  return false;
}